

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void msr_mrs_banked_exc_checks(CPUARMState_conflict *env,uint32_t tgtmode,uint32_t regno)

{
  uint uVar1;
  uint32_t target_el;
  
  uVar1 = env->uncached_cpsr & 0x1f;
  if (regno == 0x11) {
    if (uVar1 == 0x16) {
      return;
    }
    if (uVar1 == 0x1a) {
      return;
    }
  }
  else if (uVar1 != tgtmode) {
    if (tgtmode == 0x10) {
      if (regno - 8 < 5) {
        if (uVar1 == 0x11) {
          return;
        }
      }
      else {
        if (regno == 0xe) {
          if (uVar1 == 0x1a) goto LAB_0062a5d1;
        }
        else if (regno != 0xd) {
          return;
        }
        if (uVar1 != 0x1f) {
          return;
        }
      }
    }
    else if (uVar1 == 0x16 || tgtmode != 0x1a) {
      return;
    }
  }
LAB_0062a5d1:
  target_el = exception_target_el(env);
  raise_exception_aarch64(env,1,0x2000000,target_el);
}

Assistant:

static void msr_mrs_banked_exc_checks(CPUARMState *env, uint32_t tgtmode,
                                      uint32_t regno)
{
    /* Raise an exception if the requested access is one of the UNPREDICTABLE
     * cases; otherwise return. This broadly corresponds to the pseudocode
     * BankedRegisterAccessValid() and SPSRAccessValid(),
     * except that we have already handled some cases at translate time.
     */
    int curmode = env->uncached_cpsr & CPSR_M;

    if (regno == 17) {
        /* ELR_Hyp: a special case because access from tgtmode is OK */
        if (curmode != ARM_CPU_MODE_HYP && curmode != ARM_CPU_MODE_MON) {
            goto undef;
        }
        return;
    }

    if (curmode == tgtmode) {
        goto undef;
    }

    if (tgtmode == ARM_CPU_MODE_USR) {
        if (regno >= 8 && regno <= 12) {
            if (curmode != ARM_CPU_MODE_FIQ) {
                goto undef;
            }
        } else {
            switch (regno) {
                case 13:
                    if (curmode == ARM_CPU_MODE_SYS) {
                        goto undef;
                    }
                    break;
                case 14:
                    if (curmode == ARM_CPU_MODE_HYP || curmode == ARM_CPU_MODE_SYS) {
                        goto undef;
                    }
                    break;
                default:
                    break;
            }
        }
    }

    if (tgtmode == ARM_CPU_MODE_HYP) {
        /* SPSR_Hyp, r13_hyp: accessible from Monitor mode only */
        if (curmode != ARM_CPU_MODE_MON) {
            goto undef;
        }
    }

    return;

undef:
    raise_exception(env, EXCP_UDEF, syn_uncategorized(),
                    exception_target_el(env));
}